

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main(void)

{
  exception *e;
  version ver;
  version *__end1;
  version *__begin1;
  version (*__range1) [3];
  
  mjs::platform_init();
  tested_version_ = es5;
  test_main();
  for (__end1 = &mjs::supported_versions; __end1 != &switchD_0011fb8f::switchdataD_0021939c;
      __end1 = __end1 + 1) {
    if (*__end1 != es5) {
      tested_version_ = *__end1;
      test_main();
    }
  }
  return 0;
}

Assistant:

int main() {
    platform_init();
    try {
        // Start by testing latest version
        tested_version_ = version::latest;
        test_main();
        for (const auto ver: supported_versions) {
            if (ver == version::latest) {
                // no need to recheck
                continue;
            }
            tested_version_ = ver;
            test_main();
        }
    } catch (const std::exception& e) {
        std::wcerr << e.what() << "\n";
        std::wcerr << "Tested version: " << tested_version() << "\n";
        return 1;
    }
    return 0;
}